

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scratch_impl.h
# Opt level: O2

size_t secp256k1_scratch_max_allocation
                 (secp256k1_callback *error_callback,secp256k1_scratch *scratch,size_t objects)

{
  int iVar1;
  size_t sVar2;
  ulong uVar3;
  
  iVar1 = secp256k1_memcmp_var(scratch,"scratch",8);
  if (iVar1 == 0) {
    uVar3 = scratch->max_size - scratch->alloc_size;
    sVar2 = 0;
    if (objects * 0xf <= uVar3) {
      sVar2 = uVar3 + objects * -0xf;
    }
  }
  else {
    (*error_callback->fn)("invalid scratch space",error_callback->data);
    sVar2 = 0;
  }
  return sVar2;
}

Assistant:

static size_t secp256k1_scratch_max_allocation(const secp256k1_callback* error_callback, const secp256k1_scratch* scratch, size_t objects) {
    if (secp256k1_memcmp_var(scratch->magic, "scratch", 8) != 0) {
        secp256k1_callback_call(error_callback, "invalid scratch space");
        return 0;
    }
    /* Ensure that multiplication will not wrap around */
    if (ALIGNMENT > 1 && objects > SIZE_MAX/(ALIGNMENT - 1)) {
        return 0;
    }
    if (scratch->max_size - scratch->alloc_size <= objects * (ALIGNMENT - 1)) {
        return 0;
    }
    return scratch->max_size - scratch->alloc_size - objects * (ALIGNMENT - 1);
}